

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.h
# Opt level: O0

bool cmCPackRPMGenerator::CanGenerate(void)

{
  return true;
}

Assistant:

static bool CanGenerate()
  {
#ifdef __APPLE__
    // on MacOS enable CPackRPM iff rpmbuild is found
    std::vector<std::string> locations;
    locations.emplace_back("/sw/bin");        // Fink
    locations.emplace_back("/opt/local/bin"); // MacPorts
    return !cmSystemTools::FindProgram("rpmbuild").empty();
#else
    // legacy behavior on other systems
    return true;
#endif
  }